

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Reduce(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  uint fVerbose;
  int iVar2;
  Gia_Man_t *p;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  uint fMiterPairs;
  char *pcVar5;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  fMiterPairs = 0;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"advh"), iVar2 == 100) {
      fMiterPairs = fMiterPairs ^ 1;
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    else {
      if (iVar2 != 0x61) {
        iVar2 = -2;
        Abc_Print(-2,"usage: &reduce [-advh]\n");
        Abc_Print(-2,"\t         reduces the circuit using equivalence classes\n");
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (!bVar1) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-a     : toggle merging all equivalences [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (fMiterPairs == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-d     : toggle using dual-output merging [default = %s]\n",pcVar4);
        if (fVerbose == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
        pcVar4 = "\t-h     : print the command usage\n";
LAB_0024ecfe:
        Abc_Print(iVar2,pcVar4);
        return 1;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  pGVar3 = pAbc->pGia;
  if (pGVar3 != (Gia_Man_t *)0x0) {
    if (bVar1) {
      p = Gia_ManEquivReduce(pGVar3,1,fMiterPairs,0,fVerbose);
      pGVar3 = Gia_ManSeqStructSweep(p,1,1,0);
      Gia_ManStop(p);
    }
    else {
      pGVar3 = Gia_ManEquivReduceAndRemap(pGVar3,1,fMiterPairs);
    }
    Abc_FrameUpdateGia(pAbc,pGVar3);
    return 0;
  }
  pcVar4 = "Abc_CommandAbc9Reduce(): There is no AIG.\n";
  iVar2 = -1;
  goto LAB_0024ecfe;
}

Assistant:

int Abc_CommandAbc9Reduce( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp, * pTemp2;
    int c, fVerbose = 0;
    int fUseAll = 0;
    int fDualOut = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "advh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fUseAll ^= 1;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Reduce(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseAll )
    {
        pTemp = Gia_ManEquivReduce( pAbc->pGia, fUseAll, fDualOut, 0, fVerbose );
        pTemp = Gia_ManSeqStructSweep( pTemp2 = pTemp, 1, 1, 0 );
        Gia_ManStop( pTemp2 );
    }
    else
        pTemp = Gia_ManEquivReduceAndRemap( pAbc->pGia, 1, fDualOut );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &reduce [-advh]\n" );
    Abc_Print( -2, "\t         reduces the circuit using equivalence classes\n" );
    Abc_Print( -2, "\t-a     : toggle merging all equivalences [default = %s]\n", fUseAll? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle using dual-output merging [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}